

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger_kernel_1.cpp
# Opt level: O2

void __thiscall dlib::logger_helper_stuff::helper::helper(helper *this)

{
  ostringstream sout;
  allocator local_1a1;
  string local_1a0;
  ostream local_180;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_180);
  std::__cxx11::string::string((string *)&local_1a0,"some_name",&local_1a1);
  print_default_logger_header(&local_180,&local_1a0,(log_level *)LDEBUG,0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_180);
  return;
}

Assistant:

helper()
            {
                std::ostringstream sout;
                print_default_logger_header(sout,"some_name",LDEBUG,0);
            }